

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_color.hpp
# Opt level: O2

void __thiscall
optimization::graph_color::Conflict_Map::add_conflict
          (Conflict_Map *this,VarId *defVar,
          set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
          *useVars)

{
  map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
  *pmVar1;
  _Rb_tree_header *p_Var2;
  map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  *this_00;
  size_type sVar3;
  mapped_type *pmVar4;
  size_type sVar5;
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  *p_Var6;
  ostream *poVar7;
  _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
  *p_Var8;
  _Base_ptr p_Var9;
  uint32_t uVar10;
  VarId useVar;
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  local_88;
  map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  *local_58;
  key_type local_50;
  map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
  *local_40;
  _Rb_tree_node_base *local_38;
  
  pmVar1 = &this->merged_var_Map;
  sVar3 = std::
          map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
          ::count(pmVar1,defVar);
  if (sVar3 != 0) {
    pmVar4 = std::
             map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
             ::at(pmVar1,defVar);
    defVar->id = pmVar4->id;
  }
  sVar5 = std::
          map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
          ::count(&this->static_Map,defVar);
  p_Var2 = &local_88._M_impl.super__Rb_tree_header;
  if (sVar5 == 0) {
    local_88._M_impl._0_8_ = 0;
    local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_88._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_88._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    p_Var6 = &std::
              map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
              ::operator[](&this->static_Map,defVar)->_M_t;
    std::
    _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
    ::operator=(p_Var6,&local_88);
    std::
    _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
    ::~_Rb_tree(&local_88);
    local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_88._M_impl._0_8_ = 0;
    local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_88._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_88._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    p_Var6 = &std::
              map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
              ::operator[](&this->dynamic_Map,defVar)->_M_t;
    std::
    _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
    ::operator=(p_Var6,&local_88);
    std::
    _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
    ::~_Rb_tree(&local_88);
  }
  local_38 = &(useVars->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_58 = &this->dynamic_Map;
  local_40 = pmVar1;
  for (p_Var9 = (useVars->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left; pmVar1 = local_40,
      p_Var9 != local_38; p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
    local_50.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
    local_50.id = *(uint32_t *)&p_Var9[1]._M_parent;
    sVar3 = std::
            map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
            ::count(local_40,&local_50);
    if (sVar3 != 0) {
      pmVar4 = std::
               map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
               ::at(pmVar1,&local_50);
      local_50.id = pmVar4->id;
    }
    uVar10 = defVar->id;
    if (((uVar10 == 0x1020b) && (local_50.id == 0x1020d)) ||
       ((uVar10 == 0x1020d && (local_50.id == 0x1020b)))) {
      poVar7 = std::operator<<((ostream *)&std::cout,"find it ");
      std::endl<char,std::char_traits<char>>(poVar7);
      uVar10 = defVar->id;
    }
    if (uVar10 != local_50.id) {
      sVar5 = std::
              map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
              ::count(&this->static_Map,&local_50);
      if (sVar5 == 0) {
        local_88._M_impl._0_8_ = 0;
        local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        p_Var2 = &local_88._M_impl.super__Rb_tree_header;
        local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_88._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
        local_88._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
        p_Var6 = &std::
                  map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                  ::operator[](&this->static_Map,&local_50)->_M_t;
        std::
        _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
        ::operator=(p_Var6,&local_88);
        std::
        _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
        ::~_Rb_tree(&local_88);
        local_88._M_impl._0_8_ = 0;
        local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_88._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
        local_88._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
        p_Var6 = &std::
                  map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                  ::operator[](local_58,&local_50)->_M_t;
        std::
        _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
        ::operator=(p_Var6,&local_88);
        std::
        _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
        ::~_Rb_tree(&local_88);
      }
      p_Var8 = (_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                *)std::
                  map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                  ::operator[](&this->static_Map,defVar);
      std::
      _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
      ::_M_insert_unique<mir::inst::VarId_const&>(p_Var8,&local_50);
      p_Var8 = (_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                *)std::
                  map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                  ::operator[](&this->static_Map,&local_50);
      std::
      _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
      ::_M_insert_unique<mir::inst::VarId_const&>(p_Var8,defVar);
      this_00 = local_58;
      p_Var8 = (_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                *)std::
                  map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                  ::operator[](local_58,defVar);
      std::
      _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
      ::_M_insert_unique<mir::inst::VarId_const&>(p_Var8,&local_50);
      p_Var8 = (_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                *)std::
                  map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                  ::operator[](this_00,&local_50);
      std::
      _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
      ::_M_insert_unique<mir::inst::VarId_const&>(p_Var8,defVar);
    }
  }
  return;
}

Assistant:

void add_conflict(mir::inst::VarId defVar,
                    std::set<mir::inst::VarId> useVars) {
    if (merged_var_Map.count(defVar)) {
      defVar = merged_var_Map.at(defVar);
    }
    if (!static_Map.count(defVar)) {
      static_Map[defVar] = std::set<mir::inst::VarId>();
      dynamic_Map[defVar] = std::set<mir::inst::VarId>();
    }
    for (auto useVar : useVars) {
      if (merged_var_Map.count(useVar)) {
        useVar = merged_var_Map.at(useVar);
      }
      if (defVar.id == 66059 && useVar.id == 66061 ||
          useVar.id == 66059 && defVar.id == 66061) {
        std::cout << "find it " << std::endl;
      }
      if (defVar == useVar) {
        continue;
      }
      if (!static_Map.count(useVar)) {
        static_Map[useVar] = std::set<mir::inst::VarId>();
        dynamic_Map[useVar] = std::set<mir::inst::VarId>();
      }
      static_Map[defVar].insert(useVar);
      static_Map[useVar].insert(defVar);
      dynamic_Map[defVar].insert(useVar);
      dynamic_Map[useVar].insert(defVar);
    }
  }